

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInApi::ignoreTypes(MidiInApi *this,bool midiSysex,bool midiTime,bool midiSense)

{
  bool midiSense_local;
  bool midiTime_local;
  bool midiSysex_local;
  MidiInApi *this_local;
  
  (this->inputData_).ignoreFlags = '\0';
  if (midiSysex) {
    (this->inputData_).ignoreFlags = '\x01';
  }
  if (midiTime) {
    (this->inputData_).ignoreFlags = (this->inputData_).ignoreFlags | 2;
  }
  if (midiSense) {
    (this->inputData_).ignoreFlags = (this->inputData_).ignoreFlags | 4;
  }
  return;
}

Assistant:

void MidiInApi :: ignoreTypes( bool midiSysex, bool midiTime, bool midiSense )
{
  inputData_.ignoreFlags = 0;
  if ( midiSysex ) inputData_.ignoreFlags = 0x01;
  if ( midiTime ) inputData_.ignoreFlags |= 0x02;
  if ( midiSense ) inputData_.ignoreFlags |= 0x04;
}